

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_defer_io_task(intptr_t uuid,fio_defer_iotask_args_s args)

{
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  undefined8 *puVar1;
  int *piVar2;
  fio_defer_iotask_args_s *cpy;
  intptr_t uuid_local;
  
  if (args.task == (_func_void_intptr_t_fio_protocol_s_ptr_void_ptr *)0x0) {
    if (args.fallback != (_func_void_intptr_t_void_ptr *)0x0) {
      task.arg1 = (void *)uuid;
      task.func = (_func_void_void_ptr_void_ptr *)args.fallback;
      task.arg2 = args.udata;
      fio_defer_push_task_fn(task,&task_queue_normal);
      fio_defer_thread_signal();
    }
  }
  else {
    puVar1 = (undefined8 *)fio_malloc(0x20);
    if (puVar1 == (undefined8 *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3481"
                      );
      }
      kill(0,2);
      piVar2 = __errno_location();
      exit(*piVar2);
    }
    *puVar1 = args._0_8_;
    puVar1[1] = args.task;
    puVar1[2] = args.udata;
    puVar1[3] = args.fallback;
    task_00.arg1 = (void *)uuid;
    task_00.func = fio_io_task_perform;
    task_00.arg2 = puVar1;
    fio_defer_push_task_fn(task_00,&task_queue_normal);
    fio_defer_thread_signal();
  }
  return;
}

Assistant:

void fio_defer_io_task FIO_IGNORE_MACRO(intptr_t uuid,
                                        fio_defer_iotask_args_s args) {
  if (!args.task) {
    if (args.fallback)
      fio_defer_push_task((void (*)(void *, void *))args.fallback, (void *)uuid,
                          args.udata);
    return;
  }
  fio_defer_iotask_args_s *cpy = fio_malloc(sizeof(*cpy));
  FIO_ASSERT_ALLOC(cpy);
  *cpy = args;
  fio_defer_push_task(fio_io_task_perform, (void *)uuid, cpy);
}